

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_pHYs(ucvector *out,LodePNGInfo *info)

{
  size_t sVar1;
  uint uVar2;
  uint extraout_EAX;
  uchar *puVar3;
  ulong uVar4;
  ulong __size;
  ucvector data;
  ucvector local_48;
  
  local_48.data = (uchar *)0x0;
  local_48.size = 0;
  local_48.allocsize = 0;
  lodepng_add32bitInt(&local_48,info->phys_x);
  lodepng_add32bitInt(&local_48,info->phys_y);
  sVar1 = local_48.size;
  uVar2 = info->phys_unit;
  uVar4 = local_48.size + 1;
  puVar3 = local_48.data;
  __size = local_48.allocsize;
  if (local_48.allocsize < uVar4) {
    __size = uVar4 * 3 >> 1;
    if (local_48.allocsize * 2 < uVar4) {
      __size = uVar4;
    }
    puVar3 = (uchar *)realloc(local_48.data,__size);
    if (puVar3 == (uchar *)0x0) goto LAB_0010f8d8;
  }
  local_48.allocsize = __size;
  local_48.data = puVar3;
  local_48.data[sVar1] = (uchar)uVar2;
  local_48.size = uVar4;
LAB_0010f8d8:
  puVar3 = local_48.data;
  uVar2 = lodepng_chunk_create(&out->data,&out->size,(uint)local_48.size,"pHYs",local_48.data);
  if (uVar2 == 0) {
    out->allocsize = out->size;
  }
  local_48.size = 0;
  local_48.allocsize = 0;
  free(puVar3);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_pHYs(ucvector* out, const LodePNGInfo* info)
{
  unsigned error = 0;
  ucvector data;
  ucvector_init(&data);

  lodepng_add32bitInt(&data, info->phys_x);
  lodepng_add32bitInt(&data, info->phys_y);
  ucvector_push_back(&data, info->phys_unit);

  error = addChunk(out, "pHYs", data.data, data.size);
  ucvector_cleanup(&data);

  return error;
}